

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical.cxx
# Opt level: O2

bool __thiscall Unit::setNamesStandard(Unit *this)

{
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  char *pcVar4;
  string local_348 [32];
  stringstream symbol;
  ostream local_318;
  stringstream name;
  ostream local_190;
  
  if (this->bInvalid == true) {
    std::__cxx11::string::assign((char *)&this->sUnitName);
    std::__cxx11::string::assign((char *)&this->sUnitSymbol);
    return true;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&symbol);
  std::__cxx11::stringstream::stringstream((stringstream *)&name);
  switch(this->nExpPrefix) {
  case 0:
    pcVar4 = "";
    std::operator<<(&local_318,"");
    break;
  case 1:
    std::operator<<(&local_318,"da");
    pcVar4 = "deca";
    break;
  case 2:
    std::operator<<(&local_318,'h');
    pcVar4 = "hecto";
    break;
  case 3:
    std::operator<<(&local_318,'k');
    pcVar4 = "kilo";
    break;
  case 6:
    std::operator<<(&local_318,'M');
    pcVar4 = "mega";
    break;
  case 9:
    std::operator<<(&local_318,'G');
    pcVar4 = "giga";
    break;
  case 0xc:
    std::operator<<(&local_318,'T');
    pcVar4 = "tera";
    break;
  case 0xf:
    std::operator<<(&local_318,'P');
    pcVar4 = "peta";
    break;
  case 0x12:
    std::operator<<(&local_318,'E');
    pcVar4 = "exa";
    break;
  case 0x15:
    std::operator<<(&local_318,'Z');
    pcVar4 = "zetta";
    break;
  case 0x18:
    std::operator<<(&local_318,'Y');
    pcVar4 = "yotta";
    break;
  case -0x18:
    std::operator<<(&local_318,'y');
    pcVar4 = "yocto";
    break;
  default:
    poVar2 = std::operator<<(&local_318,"10^");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->nExpPrefix);
    std::operator<<(poVar2,' ');
    goto LAB_0013962c;
  case -0x15:
    std::operator<<(&local_318,'z');
    pcVar4 = "zepto";
    break;
  case -0x12:
    std::operator<<(&local_318,'a');
    pcVar4 = "atto";
    break;
  case -0xf:
    std::operator<<(&local_318,'f');
    pcVar4 = "femto";
    break;
  case -0xc:
    std::operator<<(&local_318,'p');
    pcVar4 = "pico";
    break;
  case -9:
    std::operator<<(&local_318,'n');
    pcVar4 = "nano";
    break;
  case -6:
    std::operator<<(&local_318,'u');
    pcVar4 = "micro";
    break;
  case -3:
    std::operator<<(&local_318,'m');
    pcVar4 = "milli";
    break;
  case -2:
    std::operator<<(&local_318,'c');
    pcVar4 = "centi";
    break;
  case -1:
    std::operator<<(&local_318,'d');
    pcVar4 = "deci";
  }
  std::operator<<(&local_190,pcVar4);
LAB_0013962c:
  bVar1 = equals(this,0,0,0,0,0,0,0);
  if (bVar1) {
    pcVar4 = "";
    std::operator<<(&local_318,"");
  }
  else {
    bVar1 = equals(this,1,0,0,0,0,0,0);
    if (bVar1) {
      std::operator<<(&local_318,"m");
      pcVar4 = "meter";
    }
    else {
      bVar1 = equals(this,0,1,0,0,0,0,0);
      if (bVar1) {
        std::operator<<(&local_318,"kg");
        pcVar4 = "kilogram";
      }
      else {
        bVar1 = equals(this,0,0,1,0,0,0,0);
        if (bVar1) {
          std::operator<<(&local_318,"s");
          pcVar4 = "second";
        }
        else {
          bVar1 = equals(this,0,0,0,1,0,0,0);
          if (bVar1) {
            std::operator<<(&local_318,"A");
            pcVar4 = "ampere";
          }
          else {
            bVar1 = equals(this,0,0,0,0,1,0,0);
            if (bVar1) {
              std::operator<<(&local_318,"K");
              pcVar4 = "kelvin";
            }
            else {
              bVar1 = equals(this,0,0,0,0,0,1,0);
              if (bVar1) {
                std::operator<<(&local_318,"mol");
                pcVar4 = "mole";
              }
              else {
                bVar1 = equals(this,0,0,0,0,0,0,1);
                if (bVar1) {
                  std::operator<<(&local_318,"cd");
                  pcVar4 = "candela";
                }
                else {
                  bVar1 = equals(this,1,1,-2,0,0,0,0);
                  if (bVar1) {
                    std::operator<<(&local_318,'N');
                    pcVar4 = "newton";
                  }
                  else {
                    bVar1 = equals(this,-1,1,-2,0,0,0,0);
                    if (bVar1) {
                      std::operator<<(&local_318,"Pa");
                      pcVar4 = "pascal";
                    }
                    else {
                      bVar1 = equals(this,2,1,-2,0,0,0,0);
                      if (bVar1) {
                        std::operator<<(&local_318,'J');
                        pcVar4 = "joule";
                      }
                      else {
                        bVar1 = equals(this,2,1,-3,0,0,0,0);
                        if (bVar1) {
                          std::operator<<(&local_318,'W');
                          pcVar4 = "watt";
                        }
                        else {
                          bVar1 = equals(this,0,0,1,1,0,0,0);
                          if (bVar1) {
                            std::operator<<(&local_318,'C');
                            pcVar4 = "coulomb";
                          }
                          else {
                            bVar1 = equals(this,2,1,-3,-1,0,0,0);
                            if (bVar1) {
                              std::operator<<(&local_318,'V');
                              pcVar4 = "volt";
                            }
                            else {
                              bVar1 = equals(this,-2,-1,4,2,0,0,0);
                              if (bVar1) {
                                std::operator<<(&local_318,'F');
                                pcVar4 = "farad";
                              }
                              else {
                                bVar1 = equals(this,2,1,-3,-2,0,0,0);
                                if (bVar1) {
                                  std::operator<<(&local_318,'O');
                                  pcVar4 = "ohm";
                                }
                                else {
                                  bVar1 = equals(this,-2,-1,3,2,0,0,0);
                                  if (bVar1) {
                                    std::operator<<(&local_318,'S');
                                    pcVar4 = "siemens";
                                  }
                                  else {
                                    bVar1 = equals(this,2,1,-2,-1,0,0,0);
                                    if (bVar1) {
                                      std::operator<<(&local_318,"Wb");
                                      pcVar4 = "weber";
                                    }
                                    else {
                                      bVar1 = equals(this,0,1,-2,-1,0,0,0);
                                      if (bVar1) {
                                        std::operator<<(&local_318,'T');
                                        pcVar4 = "tesla";
                                      }
                                      else {
                                        bVar1 = equals(this,-2,0,0,0,0,0,1);
                                        if (bVar1) {
                                          std::operator<<(&local_318,"lx");
                                          pcVar4 = "lux";
                                        }
                                        else {
                                          bVar1 = equals(this,0,0,-1,0,0,1,0);
                                          if (bVar1) {
                                            std::operator<<(&local_318,"kat");
                                            pcVar4 = "katal";
                                          }
                                          else {
                                            bVar3 = false;
                                            bVar1 = equals(this,0,0,-1,0,0,0,0);
                                            if (!bVar1) goto LAB_00139b99;
                                            std::operator<<(&local_318,"Hz");
                                            pcVar4 = "Hertz";
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar3 = true;
  std::operator<<(&local_190,pcVar4);
LAB_00139b99:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->sUnitName,local_348);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->sUnitSymbol,local_348);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  std::__cxx11::stringstream::~stringstream((stringstream *)&symbol);
  return bVar3;
}

Assistant:

bool Unit::setNamesStandard()
{
	bool match = false;
	
	if (bInvalid) {
		sUnitName = "unit unvalid";
		sUnitSymbol = "uv";
		return true;
	}
	
	stringstream symbol;
	stringstream name;
	
	// the prefix
	switch(nExpPrefix) {
		case -24:
			symbol << 'y'; name << "yocto"; break;
		case -21:
			symbol << 'z'; name << "zepto"; break;
		case -18:
			symbol << 'a'; name << "atto"; break;
		case -15:
			symbol << 'f'; name << "femto"; break;
		case -12:
			symbol << 'p'; name << "pico"; break;
		case -9:
			symbol << 'n'; name << "nano"; break;
		case -6:
			symbol << 'u'; name << "micro"; break;
		case -3:
			symbol << 'm'; name << "milli"; break;
		case -2:
			symbol << 'c'; name << "centi"; break;
		case -1:
			symbol << 'd'; name << "deci"; break;
		case 1:
			symbol << "da"; name << "deca"; break;
		case 0:
			symbol << ""; name << ""; break;
		case 2:
			symbol << 'h'; name << "hecto"; break;
		case 3:
			symbol << 'k'; name << "kilo"; break;
		case 6:
			symbol << 'M'; name << "mega"; break;
		case 9:
			symbol << 'G'; name << "giga"; break;
		case 12:
			symbol << 'T'; name << "tera"; break;
		case 15:
			symbol << 'P'; name << "peta"; break;
		case 18:
			symbol << 'E'; name << "exa"; break;
		case 21:
			symbol << 'Z'; name << "zetta"; break;
		case 24:
			symbol << 'Y'; name << "yotta"; break;
		default:
			symbol << "10^" << nExpPrefix << ' '; break;
	}
/*	sUnitName = name.str();
	sUnitSymbol = symbol.str();
	name.clear();
	symbol.clear();
*/	
	// the basics
	if (equals(0,0,0,0,0,0,0)) {
		symbol << "";
		name << ""; // was "no unit"
		match = true;
	} else if (equals(1,0,0,0,0,0,0)) {
		symbol << "m";
		name << "meter";
		match = true;
	} else if (equals(0,1,0,0,0,0,0)) {
		symbol << "kg";
		name << "kilogram";
		match = true;
	} else if (equals(0,0,1,0,0,0,0)) {
		symbol << "s";
		name << "second";
		match = true;
	} else if (equals(0,0,0,1,0,0,0)) {
		symbol << "A";
		name << "ampere";
		match = true;
	} else if (equals(0,0,0,0,1,0,0)) { 
		symbol << "K";
		name << "kelvin";
		match = true;
	} else if (equals(0,0,0,0,0,1,0)) {
		symbol << "mol";
		name << "mole";
		match = true;
	} else if (equals(0,0,0,0,0,0,1)) {
		symbol << "cd";
		name << "candela";
		match = true;
	}
	
	// special
	else if (equals(1,1,-2,0,0,0,0)) {
		symbol << 'N';
		name << "newton";
		match = true;
	} else if (equals(-1,1,-2,0,0,0,0)) {
		symbol << "Pa";
		name << "pascal";
		match = true;
	} else if (equals(2,1,-2,0,0,0,0)) {
		symbol << 'J';
		name << "joule";
		match = true;
	} else if (equals(2,1,-3,0,0,0,0)) {
		symbol << 'W';
		name << "watt";
		match = true;
	} else if (equals(0,0,1,1,0,0,0)) {
		symbol << 'C';
		name << "coulomb";
		match = true;
	} else if (equals(2,1,-3,-1,0,0,0)) {
		symbol << 'V';
		name << "volt";
		match = true;
	} else if (equals(-2,-1,4,2,0,0,0)) {
		symbol << 'F';
		name << "farad";
		match = true;
	} else if (equals(2,1,-3,-2,0,0,0)) {
		symbol << 'O'; // should we do something like \Omega?
		name << "ohm";
		match = true;
	} else if (equals(-2,-1,3,2,0,0,0)) {
		symbol << 'S';
		name << "siemens";
		match = true;
	} else if (equals(2,1,-2,-1,0,0,0)) {
		symbol << "Wb";
		name << "weber";
		match = true;
	} else if (equals(0,1,-2,-1,0,0,0)) {
		symbol << 'T';
		name << "tesla";
		match = true;
	} else if (equals(2,1,-2,-1,0,0,0)) {
		symbol << 'H';
		name << "henry";
		match = true;
	} else if (equals(-2,0,0,0,0,0,1)) {
		symbol << "lx";
		name << "lux";
		match = true;
	} else if (equals(0,0,-1,0,0,1,0)) {
		symbol << "kat";
		name << "katal";
		match = true;
	} else if (equals(0,0,-1,0,0,0,0)) {
		symbol << "Hz";
		name << "Hertz";
		match = true;
	}
	
	sUnitName = name.str();
	sUnitSymbol = symbol.str();
	return match;
}